

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

void Unr_ManFree(Unr_Man_t *p)

{
  int *piVar1;
  
  Gia_ManStop(p->pFrames);
  if (p->vOrder != (Vec_Int_t *)0x0) {
    piVar1 = p->vOrder->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vOrder->pArray = (int *)0x0;
    }
    if (p->vOrder != (Vec_Int_t *)0x0) {
      free(p->vOrder);
      p->vOrder = (Vec_Int_t *)0x0;
    }
  }
  if (p->vOrderLim != (Vec_Int_t *)0x0) {
    piVar1 = p->vOrderLim->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vOrderLim->pArray = (int *)0x0;
    }
    if (p->vOrderLim != (Vec_Int_t *)0x0) {
      free(p->vOrderLim);
      p->vOrderLim = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTents != (Vec_Int_t *)0x0) {
    piVar1 = p->vTents->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTents->pArray = (int *)0x0;
    }
    if (p->vTents != (Vec_Int_t *)0x0) {
      free(p->vTents);
      p->vTents = (Vec_Int_t *)0x0;
    }
  }
  if (p->vRanks != (Vec_Int_t *)0x0) {
    piVar1 = p->vRanks->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vRanks->pArray = (int *)0x0;
    }
    if (p->vRanks != (Vec_Int_t *)0x0) {
      free(p->vRanks);
      p->vRanks = (Vec_Int_t *)0x0;
    }
  }
  if (p->vObjLim != (Vec_Int_t *)0x0) {
    piVar1 = p->vObjLim->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vObjLim->pArray = (int *)0x0;
    }
    if (p->vObjLim != (Vec_Int_t *)0x0) {
      free(p->vObjLim);
      p->vObjLim = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCiMap != (Vec_Int_t *)0x0) {
    piVar1 = p->vCiMap->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vCiMap->pArray = (int *)0x0;
    }
    if (p->vCiMap != (Vec_Int_t *)0x0) {
      free(p->vCiMap);
      p->vCiMap = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCoMap != (Vec_Int_t *)0x0) {
    piVar1 = p->vCoMap->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vCoMap->pArray = (int *)0x0;
    }
    if (p->vCoMap != (Vec_Int_t *)0x0) {
      free(p->vCoMap);
      p->vCoMap = (Vec_Int_t *)0x0;
    }
  }
  if (p->vPiLits != (Vec_Int_t *)0x0) {
    piVar1 = p->vPiLits->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vPiLits->pArray = (int *)0x0;
    }
    if (p->vPiLits != (Vec_Int_t *)0x0) {
      free(p->vPiLits);
      p->vPiLits = (Vec_Int_t *)0x0;
    }
  }
  if (p->pObjs != (int *)0x0) {
    free(p->pObjs);
    p->pObjs = (int *)0x0;
  }
  if (p != (Unr_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Unr_ManFree( Unr_Man_t * p )
{
    Gia_ManStop( p->pFrames );
    // intermediate data
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vOrderLim );
    Vec_IntFreeP( &p->vTents );
    Vec_IntFreeP( &p->vRanks );
    // unrolling data
    Vec_IntFreeP( &p->vObjLim );
    Vec_IntFreeP( &p->vCiMap );
    Vec_IntFreeP( &p->vCoMap );
    Vec_IntFreeP( &p->vPiLits );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}